

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void compute_rnn(RNNState *rnn,float *gains,float *vad,float *input)

{
  float local_e38 [2];
  float denoise_input [384];
  float noise_input [384];
  float dense_out [128];
  int local_2c;
  int i;
  float *input_local;
  float *vad_local;
  float *gains_local;
  RNNState *rnn_local;
  
  compute_dense(rnn->model->input_dense,noise_input + 0x17e,input);
  compute_gru(rnn->model->vad_gru,rnn->vad_gru_state,noise_input + 0x17e);
  compute_dense(rnn->model->vad_output,vad,rnn->vad_gru_state);
  for (local_2c = 0; local_2c < rnn->model->input_dense_size; local_2c = local_2c + 1) {
    denoise_input[(long)local_2c + 0x17e] = noise_input[(long)local_2c + 0x17e];
  }
  for (local_2c = 0; local_2c < rnn->model->vad_gru_size; local_2c = local_2c + 1) {
    denoise_input[(long)(local_2c + rnn->model->input_dense_size) + 0x17e] =
         rnn->vad_gru_state[local_2c];
  }
  for (local_2c = 0; local_2c < 0x2a; local_2c = local_2c + 1) {
    denoise_input
    [(long)(local_2c + rnn->model->input_dense_size + rnn->model->vad_gru_size) + 0x17e] =
         input[local_2c];
  }
  compute_gru(rnn->model->noise_gru,rnn->noise_gru_state,denoise_input + 0x17e);
  for (local_2c = 0; local_2c < rnn->model->vad_gru_size; local_2c = local_2c + 1) {
    local_e38[local_2c] = rnn->vad_gru_state[local_2c];
  }
  for (local_2c = 0; local_2c < rnn->model->noise_gru_size; local_2c = local_2c + 1) {
    local_e38[local_2c + rnn->model->vad_gru_size] = rnn->noise_gru_state[local_2c];
  }
  for (local_2c = 0; local_2c < 0x2a; local_2c = local_2c + 1) {
    local_e38[local_2c + rnn->model->vad_gru_size + rnn->model->noise_gru_size] = input[local_2c];
  }
  compute_gru(rnn->model->denoise_gru,rnn->denoise_gru_state,local_e38);
  compute_dense(rnn->model->denoise_output,gains,rnn->denoise_gru_state);
  return;
}

Assistant:

void compute_rnn(RNNState *rnn, float *gains, float *vad, const float *input) {
    int i;
    float dense_out[MAX_NEURONS];
    float noise_input[MAX_NEURONS * 3];
    float denoise_input[MAX_NEURONS * 3];

    // 获得 vad output
    compute_dense(rnn->model->input_dense, dense_out, input);
    compute_gru(rnn->model->vad_gru, rnn->vad_gru_state, dense_out);
    compute_dense(rnn->model->vad_output, vad, rnn->vad_gru_state);

    // noise_input[0, 24) = dense_out 对应Architecture左侧的Dense tanh(24)
    for (i = 0; i < rnn->model->input_dense_size; i++) noise_input[i] = dense_out[i];
    for (i = 0; i < rnn->model->vad_gru_size; i++)
        noise_input[i + rnn->model->input_dense_size] = rnn->vad_gru_state[i];
    for (i = 0; i < INPUT_SIZE; i++)
        noise_input[i + rnn->model->input_dense_size + rnn->model->vad_gru_size] = input[i];
    compute_gru(rnn->model->noise_gru, rnn->noise_gru_state, noise_input);

    for (i = 0; i < rnn->model->vad_gru_size; i++) denoise_input[i] = rnn->vad_gru_state[i];
    for (i = 0; i < rnn->model->noise_gru_size; i++)
        denoise_input[i + rnn->model->vad_gru_size] = rnn->noise_gru_state[i];
    for (i = 0; i < INPUT_SIZE; i++)
        denoise_input[i + rnn->model->vad_gru_size + rnn->model->noise_gru_size] = input[i];
    compute_gru(rnn->model->denoise_gru, rnn->denoise_gru_state, denoise_input);
    compute_dense(rnn->model->denoise_output, gains, rnn->denoise_gru_state);
}